

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

char * gotcha_strstr(char *searchIn,char *searchFor)

{
  int local_28;
  int local_24;
  int j;
  int i;
  char *searchFor_local;
  char *searchIn_local;
  
  if (*searchFor != '\0') {
    for (local_24 = 0; searchIn[local_24] != '\0'; local_24 = local_24 + 1) {
      if (searchIn[local_24] == *searchFor) {
        local_28 = 1;
        while( true ) {
          if (searchFor[local_28] == '\0') {
            return searchFor + local_24;
          }
          if (searchIn[local_24 + local_28] == '\0') {
            return (char *)0x0;
          }
          if (searchFor[local_28] != searchIn[local_24 + local_28]) break;
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *gotcha_strstr(const char *searchIn, const char *searchFor) {
  int i = 0, j = 0;
  if (!searchFor[0]) return NULL;  // GCOVR_EXCL_LINE

  for (i = 0; searchIn[i]; i++) {
    if (searchIn[i] != searchFor[0]) continue;
    for (j = 1;; j++) {
      if (!searchFor[j]) return (char *)(searchFor + i);
      if (!searchIn[i + j]) return NULL;
      if (searchFor[j] != searchIn[i + j]) break;
    }
  }
  return NULL;
}